

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall SHA256_check::test_method(SHA256_check *this)

{
  string actual;
  pointer local_1a0;
  pointer local_198;
  undefined1 local_190;
  undefined8 local_188;
  shared_count sStack_180;
  string expected;
  char *local_138;
  char *local_130;
  ethash_h256_t input;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined ***local_d0;
  pointer *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined ***local_b0;
  char *local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined ***local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined ***local_70;
  pointer *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined ***local_50;
  char *local_48;
  ethash_h256_t out;
  
  builtin_memcpy(input.b,"~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~",0x20);
  sha3_256(out.b,0x20,input.b,0x20);
  std::__cxx11::string::string
            ((string *)&expected,"2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",
             (allocator *)&actual);
  bytesToHexString_abi_cxx11_(&actual,out.b,0x20);
  local_138 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_130 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x80);
  local_190 = std::operator==(&expected,&actual);
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_d0 = &local_100;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_0013a758;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "\nexpected: ";
  local_c8 = &local_198;
  local_198 = expected._M_dataplus._M_p;
  local_b0 = &local_e0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013a8d8;
  local_90 = &local_c0;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0013a918;
  local_a8 = "\n";
  local_70 = &local_a0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_0013a958;
  local_88 = "actual: ";
  local_68 = &local_1a0;
  local_1a0 = actual._M_dataplus._M_p;
  local_50 = &local_80;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_0013a998;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_0013a9d8;
  local_48 = "\n";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  std::__cxx11::string::~string((string *)&actual);
  std::__cxx11::string::~string((string *)&expected);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SHA256_check) {
	ethash_h256_t input;
	ethash_h256_t out;
	memcpy(&input, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	SHA3_256(&out, (uint8_t*)&input, 32);
	const std::string
			expected = "2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",
		actual = bytesToHexString((uint8_t*)&out, 32);
	BOOST_REQUIRE_MESSAGE(expected == actual,
			"\nexpected: " << expected.c_str() << "\n"
					<< "actual: " << actual.c_str() << "\n");
}